

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::syntax::PackageImportDeclarationSyntax*>::
emplace_back<slang::syntax::PackageImportDeclarationSyntax*>
          (SmallVectorBase<slang::syntax::PackageImportDeclarationSyntax*> *this,
          PackageImportDeclarationSyntax **args)

{
  iterator ppPVar1;
  PackageImportDeclarationSyntax **args_local;
  SmallVectorBase<slang::syntax::PackageImportDeclarationSyntax_*> *this_local;
  
  if (*(long *)(this + 8) == *(long *)(this + 0x10)) {
    ppPVar1 = SmallVectorBase<slang::syntax::PackageImportDeclarationSyntax_*>::end
                        ((SmallVectorBase<slang::syntax::PackageImportDeclarationSyntax_*> *)this);
    this_local = (SmallVectorBase<slang::syntax::PackageImportDeclarationSyntax_*> *)
                 emplaceRealloc<slang::syntax::PackageImportDeclarationSyntax*>(this,ppPVar1,args);
  }
  else {
    ppPVar1 = SmallVectorBase<slang::syntax::PackageImportDeclarationSyntax_*>::end
                        ((SmallVectorBase<slang::syntax::PackageImportDeclarationSyntax_*> *)this);
    *ppPVar1 = *args;
    *(long *)(this + 8) = *(long *)(this + 8) + 1;
    this_local = (SmallVectorBase<slang::syntax::PackageImportDeclarationSyntax_*> *)
                 SmallVectorBase<slang::syntax::PackageImportDeclarationSyntax_*>::back
                           ((SmallVectorBase<slang::syntax::PackageImportDeclarationSyntax_*> *)this
                           );
  }
  return (reference)this_local;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }